

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O3

bool __thiscall
ON_Polyline::CreateCircumscribedPolygon(ON_Polyline *this,ON_Circle *circle,int side_count)

{
  double *pdVar1;
  double dVar2;
  ON_3dPoint *pOVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ON_Circle *pOVar9;
  ON_Circle *pOVar10;
  byte bVar11;
  ON_3dPoint local_d0;
  ON_Circle local_b8;
  
  bVar11 = 0;
  bVar4 = ON_Circle::IsValid(circle);
  if (2 < side_count && bVar4) {
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              ((ON_SimpleArray<ON_3dPoint> *)this,(ulong)(side_count + 1U));
    if (side_count < (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = side_count + 1U;
    }
    pOVar9 = circle;
    pOVar10 = &local_b8;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pOVar10->plane).origin.x = (pOVar9->plane).origin.x;
      pOVar9 = (ON_Circle *)((long)pOVar9 + (ulong)bVar11 * -0x10 + 8);
      pOVar10 = (ON_Circle *)((long)pOVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    dVar2 = circle->radius;
    local_b8.radius = cos(3.141592653589793 / (double)side_count);
    local_b8.radius = dVar2 / local_b8.radius;
    uVar6 = (ulong)(uint)side_count;
    iVar8 = 1;
    lVar5 = 0;
    uVar7 = uVar6;
    do {
      ON_Circle::PointAt(&local_d0,&local_b8,
                         (double)iVar8 * (3.141592653589793 / (double)side_count));
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      *(double *)((long)&pOVar3->z + lVar5) = local_d0.z;
      pdVar1 = (double *)((long)&pOVar3->x + lVar5);
      *pdVar1 = local_d0.x;
      pdVar1[1] = local_d0.y;
      iVar8 = iVar8 + 2;
      lVar5 = lVar5 + 0x18;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar3[uVar6].z = pOVar3->z;
    dVar2 = pOVar3->y;
    pOVar3[uVar6].x = pOVar3->x;
    pOVar3[uVar6].y = dVar2;
    ON_Plane::~ON_Plane(&local_b8.plane);
  }
  else {
    ON_SimpleArray<ON_3dPoint>::SetCapacity((ON_SimpleArray<ON_3dPoint> *)this,0);
  }
  return 2 < side_count && bVar4;
}

Assistant:

bool ON_Polyline::CreateCircumscribedPolygon(
            const ON_Circle& circle,
            int side_count
            )
{
  bool rc = ( circle.IsValid() && side_count >= 3 ) ? true : false;
  if ( rc )
  {
    SetCapacity(side_count+1);
    SetCount(side_count+1);
    double half_a = ON_PI/side_count;
    int i;
    ON_Circle c = circle;
    c.radius = circle.radius/cos(half_a);
    for ( i = 0; i < side_count; i++ )
    {
      m_a[i] = c.PointAt(half_a*(1+2*i));
    }
    m_a[side_count] = m_a[0];
  }
  else
    Destroy();
  return rc;
}